

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
matchNextToken(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
               *this)

{
  UTF8Reader *this_00;
  char *pcVar1;
  bool bVar2;
  UnicodeChar UVar3;
  UnicodeChar UVar4;
  TokenType TVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint len;
  int numToSkip;
  TokenType keyword;
  CompileMessage local_90;
  UTF8Reader end;
  char local_48 [16];
  UTF8Reader local_38;
  UTF8Reader local_30;
  
  this_00 = &this->input;
  UVar3 = UTF8Reader::operator*(this_00);
  if ((UVar3 & 0xffffffdf) - 0x41 < 0x1a) {
    end.data = this_00->data;
    len = 1;
    while( true ) {
      UTF8Reader::operator++(&end);
      UVar3 = UTF8Reader::operator*(&end);
      bVar2 = StandardIdentifierMatcher::isIdentifierBody(UVar3);
      if (!bVar2) break;
      if (0xff < len) {
        Errors::identifierTooLong<>();
        (*this->_vptr_Tokeniser[2])(this,&local_90);
        CompileMessage::~CompileMessage(&local_90);
      }
      len = len + 1;
    }
    local_30.data = this_00->data;
    keyword = Keyword::Matcher::match(len,&local_30);
    if (keyword.text == (char *)0x0) {
      local_90.description._M_dataplus._M_p = (pointer)&local_90.description.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,this_00->data,end.data);
      std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      (this->input).data = end.data;
      return (TokenType)"$identifier";
    }
    UTF8Reader::operator+=(this_00,len);
    return (TokenType)keyword.text;
  }
  if ((byte)(*this_00->data - 0x30U) < 10) {
    TVar5 = parseNumericLiteral(this,false);
    return (TokenType)TVar5.text;
  }
  numToSkip = (int)this_00;
  if ((UVar3 == 0x2d) &&
     (UTF8Reader::operator+((UTF8Reader *)&local_90,numToSkip),
     (byte)(*local_90.description._M_dataplus._M_p - 0x30U) < 10)) {
    UTF8Reader::operator++(this_00);
    keyword = parseNumericLiteral(this,true);
    bVar2 = TokenType::operator==(&keyword,(TokenType *)&Token::literalInt32);
    if ((!bVar2) &&
       (bVar2 = TokenType::operator==(&keyword,(TokenType *)&Token::literalInt64), !bVar2)) {
      this->literalDoubleValue = -this->literalDoubleValue;
      return (TokenType)keyword.text;
    }
    this->literalIntValue = -this->literalIntValue;
    return (TokenType)keyword.text;
  }
  bVar2 = parseStringLiteral(this,UVar3);
  if (bVar2) {
    return (TokenType)"$string literal";
  }
  if (UVar3 == 0x2f) {
    if (this->shouldIgnoreComments == false) {
      UTF8Reader::operator+((UTF8Reader *)&local_90,numToSkip);
      UVar4 = UTF8Reader::operator*((UTF8Reader *)&local_90);
      if (UVar4 == 0x2a) {
        (this->location).location.data = (this->input).data;
        UTF8Reader::operator+((UTF8Reader *)&local_90,numToSkip);
        UTF8Reader::find(&end,(char *)&local_90);
        if (*end.data == '\0') {
          Errors::unterminatedComment<>();
          (*this->_vptr_Tokeniser[2])(this,&local_90);
          CompileMessage::~CompileMessage(&local_90);
        }
        UTF8Reader::operator+=(&end,2);
        local_90.description._M_dataplus._M_p = (pointer)&local_90.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,this_00->data,end.data);
        std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        if (UVar4 != 0x2f) goto LAB_00292540;
        UTF8Reader::find(&end,(char *)this_00);
        local_90.description._M_dataplus._M_p = (pointer)&local_90.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,(this->input).data,end.data);
        std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      (this->input).data = end.data;
      return (TokenType)"$comment";
    }
  }
  else if ((UVar3 == 0x2e) && (bVar2 = parseFloatLiteral(this), bVar2)) {
    return (TokenType)(this->literalType).text;
  }
LAB_00292540:
  keyword = StandardOperatorMatcher::match(this_00);
  if (keyword.text == (char *)0x0) {
    if (UVar3 == 0x5f) {
      UTF8Reader::operator+((UTF8Reader *)&local_90,numToSkip);
      UVar3 = UTF8Reader::operator*((UTF8Reader *)&local_90);
      bVar2 = StandardIdentifierMatcher::isIdentifierBody(UVar3);
      if (bVar2) {
        Errors::noLeadingUnderscoreAllowed<>();
        (*this->_vptr_Tokeniser[2])(this,&local_90);
        CompileMessage::~CompileMessage(&local_90);
      }
    }
    pcVar1 = this_00->data;
    if (*pcVar1 != '\0') {
      UTF8Reader::operator+(&local_38,numToSkip);
      end.data = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&end,pcVar1,local_38.data);
      Errors::illegalCharacter<std::__cxx11::string>(&local_90,(Errors *)&end,args);
      (*this->_vptr_Tokeniser[2])(this,&local_90);
      CompileMessage::~CompileMessage(&local_90);
      std::__cxx11::string::~string((string *)&end);
    }
    keyword.text = "$eof";
  }
  return (TokenType)keyword.text;
}

Assistant:

TokenType matchNextToken()
    {
        if (IdentifierMatcher::isIdentifierStart (*input))
        {
            auto end = input;
            int len = 1;

            while (IdentifierMatcher::isIdentifierBody (*++end))
                if (++len > (int) maxIdentifierLength)
                    throwError (Errors::identifierTooLong());

            if (auto keyword = KeywordList::match (len, input))
            {
                input += len;
                return keyword;
            }

            currentStringValue = std::string (input.getAddress(), end.getAddress());
            input = end;
            return IdentifierMatcher::categoriseIdentifier (currentStringValue);
        }

        if (input.isDigit())
            return parseNumericLiteral (false);

        auto currentChar = *input;

        if (currentChar == '-' && (input + 1).isDigit())
        {
            ++input;
            auto tok = parseNumericLiteral (true);

            if (tok == Token::literalInt32 || tok == Token::literalInt64)
                literalIntValue = -literalIntValue;
            else
                literalDoubleValue = -literalDoubleValue;

            return tok;
        }

        if (parseStringLiteral (currentChar))
            return Token::literalString;

        if (currentChar == '.' && parseFloatLiteral())
            return literalType;

        if (currentChar == '/' && ! shouldIgnoreComments)
        {
            auto c2 = *(input + 1);

            if (c2 == '/')
            {
                auto end = input.find ("\n");
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }

            if (c2 == '*')
            {
                location.location = input;
                auto end = (input + 2).find ("*/");
                if (end.isEmpty()) throwError (Errors::unterminatedComment());
                end += 2;
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }
        }

        if (auto op = OperatorList::match (input))
            return op;

        if (currentChar == '_' && IdentifierMatcher::isIdentifierBody (*(input + 1)))
            throwError (Errors::noLeadingUnderscoreAllowed());

        if (! input.isEmpty())
            throwError (Errors::illegalCharacter (std::string (input.getAddress(), (input + 1).getAddress())));

        return Token::eof;
    }